

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O0

void __thiscall wabt::WastParser::TokenQueue::push_back(TokenQueue *this,Token t)

{
  bool bVar1;
  optional *this_00;
  reference this_01;
  TokenQueue *this_local;
  
  this_00 = (optional *)
            std::array<std::optional<wabt::Token>,_2UL>::operator[]
                      (&this->tokens,(ulong)((this->i ^ 0xffU) & 1));
  bVar1 = std::optional::operator_cast_to_bool(this_00);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    this_01 = std::array<std::optional<wabt::Token>,_2UL>::operator[]
                        (&this->tokens,(ulong)((this->i ^ 0xffU) & 1));
    std::optional<wabt::Token>::operator=(this_01,&t);
    bVar1 = empty(this);
    if (bVar1) {
      this->i = (bool)((this->i ^ 0xffU) & 1);
    }
    return;
  }
  __assert_fail("!tokens[!i]",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/wast-parser.cc"
                ,0xf1b,"void wabt::WastParser::TokenQueue::push_back(Token)");
}

Assistant:

void WastParser::TokenQueue::push_back(Token t) {
  assert(!tokens[!i]);
  tokens[!i] = t;
  if (empty()) {
    i = !i;
  }
}